

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O2

int cubeb_register_device_collection_changed
              (cubeb *context,cubeb_device_type devtype,
              cubeb_device_collection_changed_callback callback,void *user_ptr)

{
  _func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_changed_callback_void_ptr
  *UNRECOVERED_JUMPTABLE;
  int iVar1;
  
  if ((devtype & (CUBEB_DEVICE_TYPE_OUTPUT|CUBEB_DEVICE_TYPE_INPUT)) == CUBEB_DEVICE_TYPE_UNKNOWN ||
      context == (cubeb *)0x0) {
    iVar1 = -3;
  }
  else {
    UNRECOVERED_JUMPTABLE = context->ops->register_device_collection_changed;
    if (UNRECOVERED_JUMPTABLE !=
        (_func_int_cubeb_ptr_cubeb_device_type_cubeb_device_collection_changed_callback_void_ptr *)
        0x0) {
      iVar1 = (*UNRECOVERED_JUMPTABLE)(context,devtype,callback,user_ptr);
      return iVar1;
    }
    iVar1 = -4;
  }
  return iVar1;
}

Assistant:

int
cubeb_register_device_collection_changed(
    cubeb * context, cubeb_device_type devtype,
    cubeb_device_collection_changed_callback callback, void * user_ptr)
{
  if (context == NULL ||
      (devtype & (CUBEB_DEVICE_TYPE_INPUT | CUBEB_DEVICE_TYPE_OUTPUT)) == 0)
    return CUBEB_ERROR_INVALID_PARAMETER;

  if (!context->ops->register_device_collection_changed) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  return context->ops->register_device_collection_changed(context, devtype,
                                                          callback, user_ptr);
}